

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O0

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
::const_multi_array_ref
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           *this,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 **base,storage_order_type *so,index *index_bases,size_type *extents)

{
  iterator result;
  long *in_RCX;
  unsigned_long *in_RDX;
  unsigned_long in_RSI;
  unsigned_long *in_RDI;
  long in_R8;
  array<long,_2UL> extent_list;
  long *in_stack_ffffffffffffff88;
  array<long,_2UL> *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffffa0;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  *in_stack_ffffffffffffffb0;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  *this_00;
  array<long,_2UL> local_48;
  undefined4 local_38;
  long local_28;
  long *local_20;
  unsigned_long *local_18;
  unsigned_long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  detail::multi_array::
  multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::multi_array_impl_base
            ((multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
              *)0x9163bc);
  *in_RDI = local_10;
  in_RDI[1] = *local_18;
  in_RDI[2] = local_18[1];
  in_RDI[3] = local_18[2];
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  if (local_20 == (long *)0x0) {
    in_stack_ffffffffffffff90 =
         (array<long,_2UL> *)array<long,_2UL>::begin((array<long,_2UL> *)(in_RDI + 8));
    local_38 = 0;
    std::fill_n<long*,unsigned_long,int>
              ((long *)in_stack_ffffffffffffffb0,(unsigned_long)in_RDI,in_stack_ffffffffffffffa0);
  }
  else {
    result = array<long,_2UL>::begin((array<long,_2UL> *)(in_RDI + 8));
    detail::multi_array::copy_n<long_const*,unsigned_long,long*>(local_20,2,result);
  }
  if (local_28 == 0) {
    this_00 = (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               *)0x0;
    array<long,_2UL>::assign(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    array<long,_2UL>::begin(&local_48);
    const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
    ::init_multi_array_ref<long*>(this_00,(long *)in_RDI);
  }
  else {
    const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
    ::init_multi_array_ref<unsigned_long_const*>(in_stack_ffffffffffffffb0,in_RDI);
  }
  return;
}

Assistant:

explicit
  const_multi_array_ref(TPtr base,
                        const storage_order_type& so,
                        const index * index_bases,
                        const size_type* extents) :
    base_(base), storage_(so), origin_offset_(0), directional_offset_(0)
 {
   // If index_bases or extents is null, then initialize the corresponding
   // private data to zeroed lists.
   if(index_bases) {
     boost::detail::multi_array::
       copy_n(index_bases,NumDims,index_base_list_.begin());
   } else {
     std::fill_n(index_base_list_.begin(),NumDims,0);
   }
   if(extents) {
     init_multi_array_ref(extents);
   } else {
     boost::array<index,NumDims> extent_list;
     extent_list.assign(0);
     init_multi_array_ref(extent_list.begin());
   }
 }